

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void freelev(xchar levnum)

{
  level *lev;
  mon_gen_override *__ptr;
  mon_gen_tuple *pmVar1;
  lvl_sounds *__ptr_00;
  int iVar2;
  undefined7 in_register_00000039;
  mon_gen_tuple *__ptr_01;
  lvl_sound_bite *__ptr_02;
  long lVar3;
  long lVar4;
  
  iVar2 = (int)CONCAT71(in_register_00000039,levnum);
  lev = levels[iVar2];
  free_timers(lev);
  free_light_sources(lev);
  free_monchn(lev->monlist);
  free_worm(lev);
  freetrapchn(lev->lev_traps);
  free_objchn(lev->objlist);
  free_objchn(lev->buriedobjlist);
  free_objchn(lev->billobjs);
  __ptr = lev->mon_gen;
  if (__ptr != (mon_gen_override *)0x0) {
    __ptr_01 = __ptr->gen_chances;
    while (__ptr_01 != (mon_gen_tuple *)0x0) {
      pmVar1 = __ptr_01->next;
      free(__ptr_01);
      __ptr_01 = pmVar1;
    }
    free(__ptr);
  }
  __ptr_00 = lev->sounds;
  if (__ptr_00 != (lvl_sounds *)0x0) {
    __ptr_02 = __ptr_00->sounds;
    lVar3 = 8;
    for (lVar4 = 0; lVar4 < __ptr_00->n_sounds; lVar4 = lVar4 + 1) {
      free(*(void **)((long)&__ptr_02->flags + lVar3));
      __ptr_02 = __ptr_00->sounds;
      *(undefined8 *)((long)&__ptr_02->flags + lVar3) = 0;
      lVar3 = lVar3 + 0x10;
    }
    free(__ptr_02);
    free(__ptr_00);
  }
  lev->lev_traps = (trap *)0x0;
  lev->billobjs = (obj *)0x0;
  lev->monlist = (monst *)0x0;
  lev->objlist = (obj *)0x0;
  lev->buriedobjlist = (obj *)0x0;
  lev->mon_gen = (mon_gen_override *)0x0;
  lev->sounds = (lvl_sounds *)0x0;
  free_engravings(lev);
  freedamage(lev);
  free_regions(lev);
  free(lev);
  levels[iVar2] = (level *)0x0;
  return;
}

Assistant:

void freelev(xchar levnum)
{
	struct level *lev = levels[levnum];
	
	/* must be freed before mons, objs, and buried objs */
	free_timers(lev);
	free_light_sources(lev);

	free_monchn(lev->monlist);
	free_worm(lev);
	freetrapchn(lev->lev_traps);
	free_objchn(lev->objlist);
	free_objchn(lev->buriedobjlist);
	free_objchn(lev->billobjs);
	free_mongen_override(lev->mon_gen);
	free_lvl_sounds(lev->sounds);

	lev->monlist = NULL;
	lev->lev_traps = NULL;
	lev->objlist = NULL;
	lev->buriedobjlist = NULL;
	lev->billobjs = NULL;
	lev->mon_gen = NULL;
	lev->sounds = NULL;

	free_engravings(lev);
	freedamage(lev);
	free_regions(lev);
	
	free(lev);
	levels[levnum] = NULL;
}